

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_23::EscapeAnalyzer::applyOldInteractionToReplacement
          (EscapeAnalyzer *this,Expression *old,Expression *rep)

{
  mapped_type mVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  Expression *pEVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  Expression *local_28;
  Expression *old_local;
  Expression *rep_local;
  
  uVar2 = (this->reachedInteractions)._M_h._M_bucket_count;
  uVar7 = (ulong)old % uVar2;
  p_Var3 = (this->reachedInteractions)._M_h._M_buckets[uVar7];
  local_28 = old;
  old_local = rep;
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var4 = p_Var3->_M_nxt;
    pEVar5 = (Expression *)p_Var4[1]._M_nxt;
    do {
      if (pEVar5 == old) {
        if ((rep->type).id != 1) {
          pmVar6 = std::
                   unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                   ::operator[](&this->reachedInteractions,&local_28);
          mVar1 = *pmVar6;
          pmVar6 = std::
                   unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                   ::operator[](&this->reachedInteractions,&old_local);
          *pmVar6 = mVar1;
        }
        return;
      }
      p_Var4 = p_Var4->_M_nxt;
    } while ((p_Var4 != (_Hash_node_base *)0x0) &&
            (pEVar5 = (Expression *)p_Var4[1]._M_nxt, (ulong)pEVar5 % uVar2 == uVar7));
  }
  __assert_fail("reachedInteractions.count(old)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                ,0x21d,
                "void wasm::(anonymous namespace)::EscapeAnalyzer::applyOldInteractionToReplacement(Expression *, Expression *)"
               );
}

Assistant:

void applyOldInteractionToReplacement(Expression* old, Expression* rep) {
    // We can only replace something relevant that we found in the analysis.
    // (Not only would anything else be invalid to process, but also we wouldn't
    // know what interaction to give the replacement.)
    assert(reachedInteractions.count(old));

    // The replacement should have the same interaction as the thing it
    // replaces, since it is a drop-in replacement for it. The one exception is
    // when we replace with something unreachable, which is the result of us
    // figuring out that some code will trap at runtime. In that case, we've
    // made the code unreachable and the allocation does not interact with that
    // code at all.
    if (rep->type != Type::unreachable) {
      reachedInteractions[rep] = reachedInteractions[old];
    }
  }